

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

uint32_t __thiscall spirv_cross::CompilerMSL::build_constant_uint_array_pointer(CompilerMSL *this)

{
  uint32_t uVar1;
  uint32_t id_;
  SPIRType *pSVar2;
  StorageClass local_2e0;
  TypedID<(spirv_cross::Types)1> local_2dc;
  undefined1 local_2d8 [8];
  SPIRType uint_type_pointer2;
  TypedID<(spirv_cross::Types)1> local_174;
  undefined1 local_170 [8];
  SPIRType uint_type_pointer;
  uint32_t var_id;
  uint32_t type_ptr_ptr_id;
  uint32_t type_ptr_id;
  uint32_t offset;
  CompilerMSL *this_local;
  
  uVar1 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
  uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_ = uVar1 + 1;
  uint_type_pointer.member_name_cache._M_h._M_single_bucket._0_4_ = uVar1 + 2;
  pSVar2 = get_uint_type(this);
  SPIRType::SPIRType((SPIRType *)local_170,pSVar2);
  uint_type_pointer.array_size_literal.stack_storage.aligned_char[4] = '\x01';
  uint_type_pointer.array_size_literal.stack_storage.aligned_char._0_4_ =
       uint_type_pointer.array_size_literal.stack_storage.aligned_char._0_4_ + 1;
  id_ = get_uint_type_id(this);
  TypedID<(spirv_cross::Types)1>::TypedID(&local_174,id_);
  uint_type_pointer.image.access = local_174.id;
  uint_type_pointer.pointer_depth = 2;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,uVar1,(SPIRType *)local_170);
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)
             &uint_type_pointer2.member_name_cache._M_h._M_single_bucket,uVar1);
  Compiler::set_decoration
            ((Compiler *)this,uint_type_pointer2.member_name_cache._M_h._M_single_bucket._0_4_,
             DecorationArrayStride,4);
  SPIRType::SPIRType((SPIRType *)local_2d8,(SPIRType *)local_170);
  uint_type_pointer2.array_size_literal.stack_storage.aligned_char._0_4_ =
       uint_type_pointer2.array_size_literal.stack_storage.aligned_char._0_4_ + 1;
  TypedID<(spirv_cross::Types)1>::TypedID(&local_2dc,uVar1);
  uint_type_pointer2.image.access = local_2dc.id;
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,uint_type_pointer.member_name_cache._M_h._M_single_bucket._4_4_,
             (SPIRType *)local_2d8);
  local_2e0 = StorageClassUniformConstant;
  Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass>
            ((Compiler *)this,(uint32_t)uint_type_pointer.member_name_cache._M_h._M_single_bucket,
             (uint *)((long)&uint_type_pointer.member_name_cache._M_h._M_single_bucket + 4),
             &local_2e0);
  uVar1 = (uint32_t)uint_type_pointer.member_name_cache._M_h._M_single_bucket;
  SPIRType::~SPIRType((SPIRType *)local_2d8);
  SPIRType::~SPIRType((SPIRType *)local_170);
  return uVar1;
}

Assistant:

uint32_t CompilerMSL::build_constant_uint_array_pointer()
{
	uint32_t offset = ir.increase_bound_by(3);
	uint32_t type_ptr_id = offset;
	uint32_t type_ptr_ptr_id = offset + 1;
	uint32_t var_id = offset + 2;

	// Create a buffer to hold extra data, including the swizzle constants.
	SPIRType uint_type_pointer = get_uint_type();
	uint_type_pointer.pointer = true;
	uint_type_pointer.pointer_depth++;
	uint_type_pointer.parent_type = get_uint_type_id();
	uint_type_pointer.storage = StorageClassUniform;
	set<SPIRType>(type_ptr_id, uint_type_pointer);
	set_decoration(type_ptr_id, DecorationArrayStride, 4);

	SPIRType uint_type_pointer2 = uint_type_pointer;
	uint_type_pointer2.pointer_depth++;
	uint_type_pointer2.parent_type = type_ptr_id;
	set<SPIRType>(type_ptr_ptr_id, uint_type_pointer2);

	set<SPIRVariable>(var_id, type_ptr_ptr_id, StorageClassUniformConstant);
	return var_id;
}